

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::GatherBase::Verify(GatherBase *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  reference pvVar4;
  byte *pbVar5;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  GatherBase *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_31);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,4,&local_31);
  std::allocator<unsigned_char>::~allocator(&local_31);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,0,1,1,
             0x1908,0x1401,pvVar4);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
  if (*pvVar4 == '\0') {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,1);
    if (*pvVar4 == 0xff) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,2);
      if (*pvVar4 == '\0') {
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,3);
        if (*pvVar4 == 0xff) {
          this_local = (GatherBase *)0x0;
          goto LAB_013ea77a;
        }
      }
    }
  }
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
  bVar1 = *pbVar5;
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,1);
  bVar2 = *pbVar5;
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,2);
  bVar3 = *pbVar5;
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,3);
  anon_unknown_0::Output
            ("Expected Vec4(0, 255, 0, 255), got: %d, %d, %d, %d",(ulong)bVar1,(ulong)bVar2,
             (ulong)bVar3,(ulong)*pbVar5);
  this_local = (GatherBase *)&DAT_ffffffffffffffff;
LAB_013ea77a:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return (long)this_local;
}

Assistant:

virtual long Verify()
	{
		std::vector<GLubyte> data(4);
		glReadPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
		if (data[0] != 0 || data[1] != 255 || data[2] != 0 || data[3] != 255)
		{
			Output("Expected Vec4(0, 255, 0, 255), got: %d, %d, %d, %d", data[0], data[1], data[2], data[3]);
			return ERROR;
		}
		return NO_ERROR;
	}